

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecursiveDescentParser.cpp
# Opt level: O2

shared_ptr<MyCompiler::Expression> __thiscall
MyCompiler::RecursiveDescentParser::parse<MyCompiler::Expression>(RecursiveDescentParser *this)

{
  long lVar1;
  Number *pNVar2;
  istream *piVar3;
  bool bVar4;
  SyntaxError *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  long in_RSI;
  long lVar6;
  char *pcVar7;
  shared_ptr<MyCompiler::Expression> sVar8;
  allocator local_79;
  undefined1 local_78 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_70 [4];
  shared_ptr<MyCompiler::Term> p2;
  shared_ptr<MyCompiler::AddSubOp> p1;
  
  std::make_shared<MyCompiler::Expression>();
  if (*(int *)(in_RSI + 0x30) - 3U < 2) {
    parse<MyCompiler::AddSubOp>((RecursiveDescentParser *)local_78);
    std::__shared_ptr<MyCompiler::AddSubOp,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<MyCompiler::AddSubOp,_(__gnu_cxx::_Lock_policy)2> *)
               (this->stream + 0x48),
               (__shared_ptr<MyCompiler::AddSubOp,_(__gnu_cxx::_Lock_policy)2> *)local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_70);
  }
  parse<MyCompiler::Term>((RecursiveDescentParser *)local_78);
  std::__shared_ptr<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2> *)(this->stream + 0x58),
             (__shared_ptr<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2> *)local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_70);
  lVar1 = *(long *)(this->stream + 0x48);
  _Var5._M_pi = extraout_RDX;
  if (((lVar1 != 0) &&
      (lVar6 = *(long *)(this->stream + 0x58), *(int *)(*(long *)(lVar6 + 0x48) + 4) == 1)) &&
     (*(long *)(lVar6 + 0x58) == *(long *)(lVar6 + 0x60))) {
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (lVar1 + 0x28),"-");
    if (bVar4) {
      pNVar2 = *(Number **)(*(long *)(*(long *)(this->stream + 0x58) + 0x48) + 0x58);
      Number::setNum(pNVar2,-pNVar2->num);
    }
    local_78 = (undefined1  [8])0x0;
    a_Stack_70[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_ptr<MyCompiler::AddSubOp,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<MyCompiler::AddSubOp,_(__gnu_cxx::_Lock_policy)2> *)
               (this->stream + 0x48),
               (__shared_ptr<MyCompiler::AddSubOp,_(__gnu_cxx::_Lock_policy)2> *)local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_70);
    _Var5._M_pi = extraout_RDX_00;
  }
  do {
    if (1 < *(int *)(in_RSI + 0x30) - 3U) {
      sVar8.super___shared_ptr<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = _Var5._M_pi;
      sVar8.super___shared_ptr<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (shared_ptr<MyCompiler::Expression>)
             sVar8.super___shared_ptr<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2>;
    }
    parse<MyCompiler::AddSubOp>((RecursiveDescentParser *)&p1);
    parse<MyCompiler::Term>((RecursiveDescentParser *)&p2);
    piVar3 = this->stream;
    if (((*(int *)(*(long *)(*(long *)(piVar3 + 0x58) + 0x48) + 4) == 1) &&
        (*(long *)(piVar3 + 0x68) == *(long *)(piVar3 + 0x70))) &&
       ((((((p2.super___shared_ptr<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->pFactor).
           super___shared_ptr<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         super_AbstractAstNode).caseNum == 1 &&
        (((p2.super___shared_ptr<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         vMulDivOpFactor).
         super__Vector_base<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>,_std::allocator<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>_>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         ((p2.super___shared_ptr<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         vMulDivOpFactor).
         super__Vector_base<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>,_std::allocator<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)))) {
      bVar4 = std::operator==(&((p1.
                                 super___shared_ptr<MyCompiler::AddSubOp,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->super_AbstractAstNode).value,"+");
      pNVar2 = *(Number **)(*(long *)(*(long *)(this->stream + 0x58) + 0x48) + 0x58);
      lVar1 = (((((p2.super___shared_ptr<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 pFactor).super___shared_ptr<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->pNumber).super___shared_ptr<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->num;
      lVar6 = -lVar1;
      if (bVar4) {
        lVar6 = lVar1;
      }
      Number::setNum(pNVar2,lVar6 + pNVar2->num);
      lVar1 = *(long *)(*(long *)(*(long *)(*(long *)(this->stream + 0x58) + 0x48) + 0x58) + 0x48);
      if ((int)lVar1 != lVar1) {
        this_00 = (SyntaxError *)__cxa_allocate_exception(0x10);
        bVar4 = std::operator==(&((p1.
                                   super___shared_ptr<MyCompiler::AddSubOp,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->super_AbstractAstNode).value,"+");
        pcVar7 = "attempt to subtract with overflow";
        if (bVar4) {
          pcVar7 = "attempt to add with overflow";
        }
        std::__cxx11::string::string((string *)local_78,pcVar7,&local_79);
        SyntaxError::SyntaxError(this_00,(string *)local_78);
        __cxa_throw(this_00,&SyntaxError::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      std::
      vector<std::pair<MyCompiler::AddSubOp,MyCompiler::Term>,std::allocator<std::pair<MyCompiler::AddSubOp,MyCompiler::Term>>>
      ::emplace_back<MyCompiler::AddSubOp&,MyCompiler::Term&>
                ((vector<std::pair<MyCompiler::AddSubOp,MyCompiler::Term>,std::allocator<std::pair<MyCompiler::AddSubOp,MyCompiler::Term>>>
                  *)(piVar3 + 0x68),
                 p1.super___shared_ptr<MyCompiler::AddSubOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 p2.super___shared_ptr<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p2.super___shared_ptr<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p1.super___shared_ptr<MyCompiler::AddSubOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    _Var5._M_pi = extraout_RDX_01;
  } while( true );
}

Assistant:

std::shared_ptr<MyCompiler::Expression> MyCompiler::RecursiveDescentParser::parse()
{
    auto pResult = std::make_shared<Expression>();

    if (sym == SymbolType::PLUS || sym == SymbolType::MINUS)
        pResult->pAddSubOp = parse<AddSubOp>();
    pResult->pTerm = parse<Term>();
    if (pResult->pAddSubOp != nullptr && pResult->pTerm->pFactor->caseNum == 1 &&
        pResult->pTerm->vMulDivOpFactor.empty())
    {
        if (pResult->pAddSubOp->value == "-")
            pResult->pTerm->pFactor->pNumber->setNum(-pResult->pTerm->pFactor->pNumber->num);
        pResult->pAddSubOp = nullptr;
    }
    while (sym == SymbolType::PLUS || sym == SymbolType::MINUS)
    {
        auto p1 = parse<AddSubOp>();
        auto p2 = parse<Term>();
        if (pResult->pTerm->pFactor->caseNum == 1 && pResult->vAddSubOpExpression.empty() &&
            p2->pFactor->caseNum == 1 && p2->vMulDivOpFactor.empty())
        {
            if (p1->value == "+")
                pResult->pTerm->pFactor->pNumber->setNum(
                        pResult->pTerm->pFactor->pNumber->num + p2->pFactor->pNumber->num);
            else
                pResult->pTerm->pFactor->pNumber->setNum(
                        pResult->pTerm->pFactor->pNumber->num - p2->pFactor->pNumber->num);
            if (pResult->pTerm->pFactor->pNumber->num > std::numeric_limits<int32_t>::max()
                || pResult->pTerm->pFactor->pNumber->num < std::numeric_limits<int32_t>::min())
                throw SyntaxError(
                        p1->value == "+" ? "attempt to add with overflow" : "attempt to subtract with overflow");
        }
        else
            pResult->vAddSubOpExpression.emplace_back(*p1, *p2);
    }

    return pResult;
}